

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_equation_units.cpp
# Opt level: O0

void __thiscall otherEqUnits_trits_Test::TestBody(otherEqUnits_trits_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_6;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_5;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_4;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_3;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_2;
  Message local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_1;
  Message local_38 [3];
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  otherEqUnits_trits_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    (1.0,(precise_unit *)units::precise::data::trit,
                     (precise_unit *)units::precise::data::bit_s);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_20,"convert(1.0, precise::data::trit, precise::data::bit_s)",
             "1.58496","0.00001",dVar3,1.58496,1e-05);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x205,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    (6.0,(precise_unit *)units::precise::data::trit,
                     (precise_unit *)units::precise::data::bit_s);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_50,"convert(6.0, precise::data::trit, precise::data::bit_s)","9.5",
             "0.01",dVar3,9.5,0.01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x207,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    (20.19,(precise_unit *)units::precise::data::trit,
                     (precise_unit *)units::precise::data::bit_s);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_70,"convert(20.19, precise::data::trit, precise::data::bit_s)","32.0"
             ,"0.01",dVar3,32.0,0.01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x209,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    (40.38,(precise_unit *)units::precise::data::trit,
                     (precise_unit *)units::precise::data::digits);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_90,"convert(40.38, precise::data::trit, precise::data::digits)",
             "19.27","0.01",dVar3,19.27,0.01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x20d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    (1.58496,(precise_unit *)units::precise::data::bit_s,
                     (precise_unit *)units::precise::data::trit);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b0,"convert(1.58496, precise::data::bit_s, precise::data::trit)",
             "1.0","0.00001",dVar3,1.0,1e-05);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x212,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    (9.5,(precise_unit *)units::precise::data::bit_s,
                     (precise_unit *)units::precise::data::trit);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_d0,"convert(9.5, precise::data::bit_s, precise::data::trit)","6.0",
             "0.01",dVar3,6.0,0.01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x214,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  dVar3 = units::convert<units::precise_unit,units::precise_unit>
                    (9.0,(precise_unit *)units::precise::data::digits,
                     (precise_unit *)units::precise::data::trit);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_f0,"convert(9, precise::data::digits, precise::data::trit)","18.86",
             "0.01",dVar3,18.86,0.01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_equation_units.cpp"
               ,0x216,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  return;
}

Assistant:

TEST(otherEqUnits, trits)
{
    EXPECT_NEAR(
        convert(1.0, precise::data::trit, precise::data::bit_s),
        1.58496,
        0.00001);
    EXPECT_NEAR(
        convert(6.0, precise::data::trit, precise::data::bit_s), 9.5, 0.01);
    EXPECT_NEAR(
        convert(20.19, precise::data::trit, precise::data::bit_s), 32.0, 0.01);
    EXPECT_NEAR(
        convert(40.38, precise::data::trit, precise::data::digits),
        19.27,
        0.01);

    EXPECT_NEAR(
        convert(1.58496, precise::data::bit_s, precise::data::trit),
        1.0,
        0.00001);
    EXPECT_NEAR(
        convert(9.5, precise::data::bit_s, precise::data::trit), 6.0, 0.01);
    EXPECT_NEAR(
        convert(9, precise::data::digits, precise::data::trit), 18.86, 0.01);
}